

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printManifest(char *fileName)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  ostream *poVar5;
  Header *pHVar6;
  CompressedIDManifest *pCVar7;
  long *plVar8;
  MultiPartInputFile in;
  MultiPartInputFile aMStack_68 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  IDManifest local_48 [24];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::MultiPartInputFile::MultiPartInputFile(aMStack_68,fileName,iVar2,true);
  iVar2 = 0;
  while( true ) {
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (iVar3 <= iVar2) break;
    iVar3 = Imf_3_4::MultiPartInputFile::parts();
    if (1 < iVar3) {
      if (fileName == (char *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1070f8);
      }
      else {
        sVar4 = strlen(fileName);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,fileName,sVar4);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," part ",6);
      poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,":\n",2);
    }
    pHVar6 = (Header *)Imf_3_4::MultiPartInputFile::header((int)aMStack_68);
    cVar1 = Imf_3_4::hasIDManifest(pHVar6);
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"no manifest found\n",0x12);
    }
    else {
      pHVar6 = (Header *)Imf_3_4::MultiPartInputFile::header((int)aMStack_68);
      pCVar7 = (CompressedIDManifest *)Imf_3_4::idManifest(pHVar6);
      Imf_3_4::IDManifest::IDManifest(local_48,pCVar7);
      dumpManifest(local_48);
      std::
      vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
      ::~vector((vector<Imf_3_4::IDManifest::ChannelGroupManifest,_std::allocator<Imf_3_4::IDManifest::ChannelGroupManifest>_>
                 *)local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"raw text size    : ",0x13);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"uncompressed size: ",0x13);
      poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
      std::ostream::put((char)poVar5);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"compressed size  : ",0x13);
      plVar8 = (long *)std::ostream::operator<<((ostream *)&std::cout,*(int *)pCVar7);
      std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
      std::ostream::put((char)plVar8);
      std::ostream::flush();
    }
    iVar2 = iVar2 + 1;
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  return;
}

Assistant:

void
printManifest (const char fileName[])
{

    MultiPartInputFile in (fileName);
    //
    // extract objectID attribute
    //

    for (int part = 0; part < in.parts (); part++)
    {
        if (in.parts () > 1) { cout << fileName << " part " << part << ":\n"; }
        if (hasIDManifest (in.header (part)))
        {
            const OPENEXR_IMF_NAMESPACE::CompressedIDManifest& mfst =
                idManifest (in.header (part));
            size_t size = dumpManifest (mfst);
            cout << "raw text size    : " << size << endl;
            cout << "uncompressed size: " << mfst._uncompressedDataSize << endl;
            cout << "compressed size  : " << mfst._compressedDataSize << endl;
        }
        else { cout << "no manifest found\n"; }
    }
}